

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_OptionalFieldDescriptor_Test::
~Proto3OptionalTest_OptionalFieldDescriptor_Test
          (Proto3OptionalTest_OptionalFieldDescriptor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3OptionalTest, OptionalFieldDescriptor) {
  const Descriptor* d = proto2_unittest::TestProto3Optional::descriptor();

  for (int i = 0; i < d->field_count(); i++) {
    const FieldDescriptor* f = d->field(i);
    if (absl::StartsWith(f->name(), "singular")) {
      EXPECT_FALSE(f->has_presence()) << f->full_name();
      EXPECT_FALSE(f->containing_oneof()) << f->full_name();
      EXPECT_FALSE(f->real_containing_oneof()) << f->full_name();
    } else {
      EXPECT_TRUE(f->has_presence()) << f->full_name();
      EXPECT_TRUE(f->containing_oneof()) << f->full_name();
      EXPECT_FALSE(f->real_containing_oneof()) << f->full_name();
    }
  }
}